

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::PixelStatsAccumulator::ReportCounter
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t val)

{
  Image *this_00;
  PixelStats *pPVar1;
  pointer pbVar2;
  char *pcVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Allocator alloc;
  ulong uVar5;
  ulong uVar6;
  Point2i p_00;
  pointer pIVar7;
  Point2i resolution;
  Float FVar8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ColorEncodingHandle local_150;
  Image local_148;
  
  pPVar1 = this->stats;
  uVar6 = (ulong)statIndex;
  pIVar7 = (pPVar1->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(pPVar1->counterImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pIVar7 >> 3) * -0x5075075075075075;
  if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pPVar1->counterImages,(long)(statIndex + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->counterNames,(long)(statIndex + 1));
    pbVar2 = (this->stats->counterNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)pbVar2[uVar6]._M_string_length;
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)(pbVar2 + uVar6),0,pcVar3,(ulong)name);
    pIVar7 = (this->stats->counterImages).
             super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this_00 = pIVar7 + uVar6;
  TVar4 = pIVar7[uVar6].resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar4.y != DAT_030e507c - DAT_030e5074 || TVar4.x != DAT_030e5078 - imageBounds) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    resolution.super_Tuple2<pbrt::Point2,_int>.y = DAT_030e507c - DAT_030e5074;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = DAT_030e5078 - imageBounds;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"count","");
    local_150.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = &local_170;
    Image::Image(&local_148,Float,resolution,channels,&local_150,alloc);
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.y =
         local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    this_00->format = local_148.format;
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.x =
         local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->channelNames,&local_148.channelNames);
    (this_00->encoding).
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_148.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&this_00->p8,&local_148.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&this_00->p16,&local_148.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&this_00->p32,&local_148.p32);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x = (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds;
  p_00.super_Tuple2<pbrt::Point2,_int>.y = (p->super_Tuple2<pbrt::Point2,_int>).y - DAT_030e5074;
  FVar8 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,0,FVar8 + (float)val);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportCounter(const Point2i &p, int statIndex,
                                          const char *name, int64_t val) {
    if (statIndex >= stats->counterImages.size()) {
        stats->counterImages.resize(statIndex + 1);
        stats->counterNames.resize(statIndex + 1);
        stats->counterNames[statIndex] = name;
    }

    Image &im = stats->counterImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"count"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + val);
}